

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> * __thiscall
testing::internal::
OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::GetAction
          (OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
           *this)

{
  int iVar1;
  allocator<char> local_31;
  string local_30;
  OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> *local_10;
  OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
  *this_local;
  
  iVar1 = *(int *)(this + 0xc);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_31);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return (Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }